

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaItemListRemove(xmlSchemaItemListPtr list,int idx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (list->items != (void **)0x0) {
    iVar1 = list->nbItems;
    if (idx < iVar1) {
      if (iVar1 == 1) {
        (*xmlFree)(list->items);
        list->items = (void **)0x0;
        list->nbItems = 0;
        list->sizeItems = 0;
      }
      else {
        iVar2 = (int)((long)iVar1 + -1);
        if (iVar2 == idx) {
          list->nbItems = idx;
        }
        else {
          for (lVar3 = (long)idx; lVar3 < (long)iVar1 + -1; lVar3 = lVar3 + 1) {
            list->items[lVar3] = list->items[lVar3 + 1];
          }
          list->nbItems = iVar2;
        }
      }
      return 0;
    }
  }
  __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,
                   "Internal error: xmlSchemaItemListRemove, index error.\n");
  return -1;
}

Assistant:

static int
xmlSchemaItemListRemove(xmlSchemaItemListPtr list, int idx)
{
    int i;
    if ((list->items == NULL) || (idx >= list->nbItems)) {
	xmlSchemaPSimpleErr("Internal error: xmlSchemaItemListRemove, "
	    "index error.\n");
	return(-1);
    }

    if (list->nbItems == 1) {
	/* TODO: Really free the list? */
	xmlFree(list->items);
	list->items = NULL;
	list->nbItems = 0;
	list->sizeItems = 0;
    } else if (list->nbItems -1 == idx) {
	list->nbItems--;
    } else {
	for (i = idx; i < list->nbItems -1; i++)
	    list->items[i] = list->items[i+1];
	list->nbItems--;
    }
    return(0);
}